

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

bool __thiscall
soplex::SoPlexBase<double>::getRowViolation
          (SoPlexBase<double> *this,double *maxviol,double *sumviol)

{
  bool bVar1;
  byte bVar2;
  SPxLPBase<double> *pSVar3;
  ulong uVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar5;
  double dVar6;
  VectorBase<double> activity;
  VectorBase<double> local_40;
  
  if ((this->_hasSolReal != true) || (((this->_solReal).field_0x98 & 1) == 0)) {
    if ((this->_hasSolRational != true) || (((this->_solRational).field_0xd0 & 1) == 0)) {
      return false;
    }
    if (this->_hasSolReal == false) {
      SolBase<double>::operator=(&this->_solReal,&this->_solRational);
      this->_hasSolReal = true;
    }
  }
  VectorBase<double>::VectorBase
            (&local_40,
             (this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  (*(this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x46])
            (this->_realLP,&this->_solReal,&local_40,1);
  *maxviol = 0.0;
  *sumviol = 0.0;
  uVar4 = (ulong)(this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  if ((long)uVar4 < 1) {
    if (local_40.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      return true;
    }
  }
  else {
    do {
      pSVar3 = this->_realLP;
      bVar2 = pSVar3->_isScaled;
      if ((bool)bVar2 == true) {
        (*pSVar3->lp_scaler->_vptr_SPxScaler[0x1f])
                  (pSVar3->lp_scaler,pSVar3,(ulong)((int)uVar4 - 1));
        pSVar3 = this->_realLP;
        bVar2 = pSVar3->_isScaled;
        dVar6 = extraout_XMM0_Qa;
      }
      else {
        dVar6 = (pSVar3->super_LPRowSetBase<double>).left.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar4 - 1];
      }
      if ((bVar2 & 1) == 0) {
        dVar5 = (pSVar3->super_LPRowSetBase<double>).right.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar4 - 1];
      }
      else {
        (*pSVar3->lp_scaler->_vptr_SPxScaler[0x1d])
                  (pSVar3->lp_scaler,pSVar3,(ulong)((int)uVar4 - 1));
        dVar5 = extraout_XMM0_Qa_00;
      }
      dVar6 = dVar6 - local_40.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar4 - 1];
      if ((0.0 < dVar6) && (*sumviol = *sumviol + dVar6, *maxviol <= dVar6 && dVar6 != *maxviol)) {
        *maxviol = dVar6;
      }
      dVar5 = local_40.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4 - 1] - dVar5;
      if ((0.0 < dVar5) && (*sumviol = *sumviol + dVar5, *maxviol <= dVar5 && dVar5 != *maxviol)) {
        *maxviol = dVar5;
      }
      bVar1 = 1 < uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar1);
  }
  operator_delete(local_40.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_40.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_40.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return true;
}

Assistant:

bool SoPlexBase<R>::getRowViolation(R& maxviol, R& sumviol)
{
   if(!isPrimalFeasible())
      return false;

   _syncRealSolution();
   VectorBase<R>& primal = _solReal._primal;
   assert(primal.dim() == numCols());

   VectorBase<R> activity(numRows());
   _realLP->computePrimalActivity(primal, activity, true);
   maxviol = 0.0;
   sumviol = 0.0;

   for(int i = numRows() - 1; i >= 0; i--)
   {
      R lhs = _realLP->lhsUnscaled(i);
      R rhs = _realLP->rhsUnscaled(i);

      R viol = lhs - activity[i];

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }

      viol = activity[i] - rhs;

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }
   }

   return true;
}